

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O0

void canonical_single_run<double,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *generator,size_t times)

{
  ostream *this;
  ulong in_RSI;
  double dVar1;
  size_t i;
  double total;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_000000a0;
  ulong local_20;
  double local_18;
  
  local_18 = 0.0;
  for (local_20 = 0; local_20 < in_RSI; local_20 = local_20 + 1) {
    dVar1 = std::
            generate_canonical<double,8ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      (in_stack_000000a0);
    local_18 = dVar1 + local_18;
  }
  if ((local_18 == 0.0) && (!NAN(local_18))) {
    this = std::operator<<((ostream *)&std::cout,"This is to avoid compiler optimizations.");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void canonical_single_run (G& generator, size_t times ) {
    Real total = 0.0;

    for ( size_t i = 0; i < times; ++i )
        total += generate_canonical<Real, sizeof(Real)>(generator);

    if ( total == 0 ) cout << "This is to avoid compiler optimizations." << endl;
}